

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int ctl_byname(tsd_t *tsd,char *name,void *oldp,size_t *oldlenp,void *newp,size_t newlen)

{
  _Bool _Var1;
  ctl_named_node_t *pcVar2;
  size_t *in_RCX;
  void *in_RDX;
  tsd_t *in_RDI;
  void *in_R8;
  size_t in_R9;
  ctl_named_node_t *node;
  size_t mib [7];
  ctl_node_t *nodes [7];
  size_t depth;
  int ret;
  size_t local_c8 [4];
  tsd_t *in_stack_ffffffffffffff58;
  size_t *in_stack_ffffffffffffff90;
  size_t *in_stack_ffffffffffffff98;
  ctl_node_t **in_stack_ffffffffffffffa0;
  ctl_node_t *in_stack_ffffffffffffffa8;
  tsdn_t *in_stack_ffffffffffffffb0;
  int local_3c;
  
  if ((ctl_initialized) || (_Var1 = ctl_init(in_stack_ffffffffffffff58), !_Var1)) {
    local_3c = ctl_lookup(in_stack_ffffffffffffffb0,&in_stack_ffffffffffffffa8->named,
                          in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                          in_stack_ffffffffffffff90);
    if (local_3c == 0) {
      pcVar2 = ctl_named_node(in_stack_ffffffffffffffa8);
      if ((pcVar2 == (ctl_named_node_t *)0x0) ||
         (pcVar2->ctl ==
          (_func_int_tsd_t_ptr_size_t_ptr_size_t_void_ptr_size_t_ptr_void_ptr_size_t *)0x0)) {
        local_3c = 2;
      }
      else {
        local_3c = (*pcVar2->ctl)(in_RDI,local_c8,7,in_RDX,in_RCX,in_R8,in_R9);
      }
    }
  }
  else {
    local_3c = 0xb;
  }
  return local_3c;
}

Assistant:

int
ctl_byname(tsd_t *tsd, const char *name, void *oldp, size_t *oldlenp,
    void *newp, size_t newlen) {
	int ret;
	size_t depth;
	ctl_node_t const *nodes[CTL_MAX_DEPTH];
	size_t mib[CTL_MAX_DEPTH];
	const ctl_named_node_t *node;

	if (!ctl_initialized && ctl_init(tsd)) {
		ret = EAGAIN;
		goto label_return;
	}

	depth = CTL_MAX_DEPTH;
	ret = ctl_lookup(tsd_tsdn(tsd), name, nodes, mib, &depth);
	if (ret != 0) {
		goto label_return;
	}

	node = ctl_named_node(nodes[depth-1]);
	if (node != NULL && node->ctl) {
		ret = node->ctl(tsd, mib, depth, oldp, oldlenp, newp, newlen);
	} else {
		/* The name refers to a partial path through the ctl tree. */
		ret = ENOENT;
	}

label_return:
	return(ret);
}